

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegrationTest.cpp
# Opt level: O3

void initGlobals(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  long *plVar3;
  long *plVar4;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  if (argc < 2) {
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x119cd8);
    local_b0 = &local_a0;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_a0 = *plVar4;
      lStack_98 = plVar3[3];
    }
    else {
      local_a0 = *plVar4;
      local_b0 = (long *)*plVar3;
    }
    local_a8 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
  }
  else {
    std::__cxx11::string::string((string *)&local_b0,argv[1],(allocator *)&local_50);
  }
  std::__cxx11::string::operator=((string *)&g_bread_path_abi_cxx11_,(string *)&local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (argc < 2) {
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
  }
  else if (argc != 2) {
    pcVar1 = argv[2];
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"/","");
    strlen(pcVar1);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,(ulong)pcVar1);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_a0 = *plVar4;
      lStack_98 = plVar3[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar4;
      local_b0 = (long *)*plVar3;
    }
    local_a8 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    bVar2 = true;
    goto LAB_0010d71d;
  }
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"./","");
  bVar2 = false;
LAB_0010d71d:
  std::__cxx11::string::operator=((string *)&g_inttest_dir_abi_cxx11_,(string *)&local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((bVar2) && (local_70[0] != local_60)) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (argc < 4) {
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"../test/integration/","");
  }
  else {
    pcVar1 = argv[3];
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"/test/integration/","");
    strlen(pcVar1);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,(ulong)pcVar1);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_a0 = *plVar4;
      lStack_98 = plVar3[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar4;
      local_b0 = (long *)*plVar3;
    }
    local_a8 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
  }
  std::__cxx11::string::operator=((string *)&g_src_dir_abi_cxx11_,(string *)&local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((3 < argc) && (local_90[0] != local_80)) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  return;
}

Assistant:

void initGlobals(int argc, const char* argv[])
{
  g_bread_path = (argc > 1) ? argv[1] : "./bread" + extension();
  g_inttest_dir = (argc > 2) ? argv[2] + std::string("/") : "./";
  g_src_dir = (argc > 3) ? argv[3] + std::string("/test/integration/") : "../test/integration/";
}